

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_substruct_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,int32_t *ip,CTInfo flags)

{
  uint uVar1;
  GCtab *in_RCX;
  CType *in_RDX;
  CTState *in_RSI;
  TValue *in_RDI;
  GCtab *in_R8;
  undefined4 in_R9D;
  int32_t iz;
  int32_t i;
  TValue *tv;
  CType *df;
  CTypeID id;
  cTValue *local_f0;
  uint uVar2;
  uint key;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar3;
  TValue *d_00;
  CTState *in_stack_ffffffffffffff70;
  CTState *pCVar4;
  CTState *local_60;
  
  uVar1 = (uint)(ushort)in_RSI->top;
  do {
    do {
      while( true ) {
        uVar3 = uVar1;
        if (uVar3 == 0) {
          return;
        }
        local_60 = (CTState *)(in_RDI->u64 + (ulong)uVar3 * 0x10);
        uVar1 = (uint)(ushort)local_60->top;
        if ((*(uint *)&local_60->tab >> 0x1c == 9) || (*(uint *)&local_60->tab >> 0x1c == 10))
        break;
        pCVar4 = local_60;
        if (((ulong)local_60->tab & 0xf0ff0000) == 0x80030000) {
          do {
            in_stack_ffffffffffffff70 =
                 (CTState *)(in_RDI->u64 + (ulong)(*(uint *)&pCVar4->tab & 0xffff) * 0x10);
            pCVar4 = in_stack_ffffffffffffff70;
          } while (*(uint *)&in_stack_ffffffffffffff70->tab >> 0x1c == 8);
          cconv_substruct_tab(in_RSI,in_RDX,(uint8_t *)in_RCX,in_R8,
                              (int32_t *)CONCAT44(in_R9D,uVar1),(CTInfo)((ulong)local_60 >> 0x20));
        }
      }
      uVar2 = (in_R8->nextgc).gcptr32;
    } while (((GCRef *)&local_60->sizetab)->gcptr32 == 0);
    key = uVar2;
    d_00 = in_RDI;
    if (-1 < (int)uVar2) {
      while( true ) {
        if (key < in_RCX->asize) {
          local_f0 = (cTValue *)((ulong)(in_RCX->array).ptr32 + (long)(int)key * 8);
        }
        else {
          local_f0 = lj_tab_getinth(in_RCX,key);
        }
        if ((local_f0 != (cTValue *)0x0) && ((local_f0->field_2).it != 0xffffffff)) {
          (in_R8->nextgc).gcptr32 = key + 1;
          goto LAB_001a7104;
        }
        if (key != 0) break;
        key = 1;
      }
      if (uVar2 != 0) {
        return;
      }
      (in_R8->nextgc).gcptr32 = 0xffffffff;
      key = 0xffffffff;
    }
    local_f0 = lj_tab_getstr(in_RCX,(GCstr *)(ulong)((GCRef *)&local_60->sizetab)->gcptr32);
    if ((local_f0 != (cTValue *)0x0) && ((local_f0->field_2).it != 0xffffffff)) {
LAB_001a7104:
      if (*(uint *)&local_60->tab >> 0x1c == 9) {
        do {
          local_60 = (CTState *)(in_RDI->u64 + (ulong)(*(uint *)&local_60->tab & 0xffff) * 0x10);
        } while (*(uint *)&local_60->tab >> 0x1c == 8);
        lj_cconv_ct_tv(in_stack_ffffffffffffff70,(CType *)&d_00->field_2,
                       (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60),in_RDI,
                       (CTInfo)((ulong)in_RSI >> 0x20));
      }
      else {
        lj_cconv_bf_tv((CTState *)CONCAT44(in_R9D,uVar1),(CType *)local_60,(uint8_t *)&local_f0->u64
                       ,(TValue *)CONCAT44(key,uVar2));
      }
      if (((ulong)in_RSI->tab & 0x800000) != 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void cconv_substruct_tab(CTState *cts, CType *d, uint8_t *dp,
				GCtab *t, int32_t *ip, CTInfo flags)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      TValue *tv;
      int32_t i = *ip, iz = i;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= 0) {
      retry:
	tv = (TValue *)lj_tab_getint(t, i);
	if (!tv || tvisnil(tv)) {
	  if (i == 0) { i = 1; goto retry; }  /* 1-based tables. */
	  if (iz == 0) { *ip = i = -1; goto tryname; }  /* Init named fields. */
	  break;  /* Stop at first nil. */
	}
	*ip = i + 1;
      } else {
      tryname:
	tv = (TValue *)lj_tab_getstr(t, gco2str(gcref(df->name)));
	if (!tv || tvisnil(tv)) continue;
      }
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, tv, flags);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, tv);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_tab(cts, ctype_rawchild(cts, df),
			  dp+df->size, t, ip, flags);
    }  /* Ignore all other entries in the chain. */
  }
}